

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::RunContext::RunContext(RunContext *this,IConfig *_config,IEventListenerPtr *reporter)

{
  StringRef _name;
  byte bVar1;
  IEventListener *pIVar2;
  ReporterPreferences *pRVar3;
  Context *this_00;
  unique_ptr<Catch::IEventListener> *in_RDX;
  _func_int **in_RSI;
  IResultCapture *in_RDI;
  Totals *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  byte bVar4;
  
  IResultCapture::IResultCapture(in_RDI);
  in_RDI->_vptr_IResultCapture = (_func_int **)&PTR__RunContext_002a62c8;
  _name = (StringRef)(**(code **)(*in_RSI + 0x18))();
  TestRunInfo::TestRunInfo((TestRunInfo *)(in_RDI + 1),_name);
  in_RDI[3]._vptr_IResultCapture = (_func_int **)0x0;
  in_RDI[4]._vptr_IResultCapture = (_func_int **)0x0;
  Optional<Catch::AssertionResult>::Optional((Optional<Catch::AssertionResult> *)(in_RDI + 5));
  in_RDI[0x18]._vptr_IResultCapture = in_RSI;
  Totals::Totals(in_stack_ffffffffffffff30);
  Detail::unique_ptr<Catch::IEventListener>::unique_ptr
            ((unique_ptr<Catch::IEventListener> *)(in_RDI + 0x21),in_RDX);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x18e879);
  std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::vector
            ((vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_> *)0x18e892);
  in_RDI[0x28]._vptr_IResultCapture = (_func_int **)0x0;
  in_RDI[0x29]._vptr_IResultCapture = (_func_int **)0x0;
  StringRef::StringRef((StringRef *)(in_RDI + 0x28));
  SourceLineInfo::SourceLineInfo((SourceLineInfo *)(in_RDI + 0x2a),"",0);
  in_RDI[0x2c]._vptr_IResultCapture = (_func_int **)0x0;
  in_RDI[0x2d]._vptr_IResultCapture = (_func_int **)0x0;
  StringRef::StringRef((StringRef *)(in_RDI + 0x2c));
  *(undefined4 *)&in_RDI[0x2e]._vptr_IResultCapture = 1;
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::vector
            ((vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *)0x18e91d);
  std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::vector((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
            *)0x18e936);
  TestCaseTracking::TrackerContext::TrackerContext((TrackerContext *)in_stack_ffffffffffffff30);
  FatalConditionHandler::FatalConditionHandler
            ((FatalConditionHandler *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40))
  ;
  *(undefined1 *)((long)&in_RDI[0x38]._vptr_IResultCapture + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0x38]._vptr_IResultCapture + 2) = 1;
  bVar1 = (**(code **)(*in_RDI[0x18]._vptr_IResultCapture + 0x20))();
  bVar4 = 1;
  if ((bVar1 & 1) == 0) {
    pIVar2 = Detail::unique_ptr<Catch::IEventListener>::operator->
                       ((unique_ptr<Catch::IEventListener> *)(in_RDI + 0x21));
    pRVar3 = IEventListener::getPreferences(pIVar2);
    bVar4 = pRVar3->shouldReportAllAssertions;
  }
  *(byte *)((long)&in_RDI[0x38]._vptr_IResultCapture + 3) = bVar4 & 1;
  this_00 = getCurrentMutableContext();
  Context::setResultCapture(this_00,in_RDI);
  pIVar2 = Detail::unique_ptr<Catch::IEventListener>::operator->
                     ((unique_ptr<Catch::IEventListener> *)(in_RDI + 0x21));
  (*pIVar2->_vptr_IEventListener[4])(pIVar2,in_RDI + 1);
  return;
}

Assistant:

RunContext::RunContext(IConfig const* _config, IEventListenerPtr&& reporter)
    :   m_runInfo(_config->name()),
        m_config(_config),
        m_reporter(CATCH_MOVE(reporter)),
        m_lastAssertionInfo{ StringRef(), SourceLineInfo("",0), StringRef(), ResultDisposition::Normal },
        m_includeSuccessfulResults( m_config->includeSuccessfulResults() || m_reporter->getPreferences().shouldReportAllAssertions )
    {
        getCurrentMutableContext().setResultCapture( this );
        m_reporter->testRunStarting(m_runInfo);
    }